

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderCompilationCases.cpp
# Opt level: O0

void __thiscall
deqp::gles3::Performance::ShaderCompilerCase::ShaderCompilerCase
          (ShaderCompilerCase *this,Context *context,char *name,char *description,int caseID,
          bool avoidCache,bool addWhitespaceAndComments)

{
  deUint32 dVar1;
  deUint32 dVar2;
  deUint32 dVar3;
  deUint64 dVar4;
  TestContext *this_00;
  CommandLine *this_01;
  int local_a8;
  int cmdLineIterCount;
  bool addWhitespaceAndComments_local;
  bool avoidCache_local;
  int caseID_local;
  char *description_local;
  char *name_local;
  Context *context_local;
  ShaderCompilerCase *this_local;
  
  gles3::TestCase::TestCase(&this->super_TestCase,context,NODETYPE_PERFORMANCE,name,description);
  (this->super_TestCase).super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__ShaderCompilerCase_032a4a10;
  this->m_viewportWidth = 0;
  this->m_viewportHeight = 0;
  this->m_avoidCache = avoidCache;
  this->m_addWhitespaceAndComments = addWhitespaceAndComments;
  dVar4 = deGetTime();
  dVar1 = deUint64Hash(dVar4);
  dVar4 = deGetMicroseconds();
  dVar2 = deUint64Hash(dVar4);
  dVar3 = ::deInt32Hash(caseID);
  this->m_startHash = dVar1 ^ dVar2 ^ dVar3;
  this_00 = gles3::Context::getTestContext(context);
  this_01 = tcu::TestContext::getCommandLine(this_00);
  local_a8 = tcu::CommandLine::getTestIterationCount(this_01);
  if (local_a8 < 1) {
    local_a8 = 0xf;
  }
  this->m_minimumMeasurementCount = local_a8;
  this->m_maximumMeasurementCount = this->m_minimumMeasurementCount * 3;
  return;
}

Assistant:

ShaderCompilerCase::ShaderCompilerCase (Context& context, const char* name, const char* description, int caseID, bool avoidCache, bool addWhitespaceAndComments)
	: TestCase								(context, tcu::NODETYPE_PERFORMANCE, name, description)
	, m_viewportWidth						(0)
	, m_viewportHeight						(0)
	, m_avoidCache							(avoidCache)
	, m_addWhitespaceAndComments			(addWhitespaceAndComments)
	, m_startHash							((deUint32)(deUint64Hash(deGetTime()) ^ deUint64Hash(deGetMicroseconds()) ^ deInt32Hash(caseID)))
{
	int cmdLineIterCount = context.getTestContext().getCommandLine().getTestIterationCount();
	m_minimumMeasurementCount = cmdLineIterCount > 0 ? cmdLineIterCount : DEFAULT_MINIMUM_MEASUREMENT_COUNT;
	m_maximumMeasurementCount = m_minimumMeasurementCount*3;
}